

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

QXmlStreamNamespaceDeclarations * __thiscall
QXmlStreamReader::namespaceDeclarations
          (QXmlStreamNamespaceDeclarations *__return_storage_ptr__,QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  Data *pDVar1;
  long lVar2;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  lVar2 = *(qsizetype *)((long)&(this_00._M_head_impl)->publicNamespaceDeclarations + 0x10);
  if (lVar2 == 0) {
    if ((this_00._M_head_impl)->type == StartElement) {
      QXmlStreamReaderPrivate::resolvePublicNamespaces(this_00._M_head_impl);
      lVar2 = *(qsizetype *)((long)&(this_00._M_head_impl)->publicNamespaceDeclarations + 0x10);
    }
    else {
      lVar2 = 0;
    }
  }
  pDVar1 = ((this_00._M_head_impl)->publicNamespaceDeclarations).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr =
       *(QXmlStreamNamespaceDeclaration **)
        ((long)&(this_00._M_head_impl)->publicNamespaceDeclarations + 8);
  (__return_storage_ptr__->d).size = lVar2;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QXmlStreamNamespaceDeclarations QXmlStreamReader::namespaceDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->publicNamespaceDeclarations.isEmpty() && d->type == StartElement)
        const_cast<QXmlStreamReaderPrivate *>(d)->resolvePublicNamespaces();
    return d->publicNamespaceDeclarations;
}